

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O0

uint64_t rapidjson::internal::BigInteger::ParseUint64(char *begin,char *end)

{
  RapidJSONException *this;
  char *local_28;
  char *p;
  uint64_t r;
  char *end_local;
  char *begin_local;
  
  p = (char *)0x0;
  local_28 = begin;
  while( true ) {
    if (local_28 == end) {
      return (uint64_t)p;
    }
    if ((*local_28 < '0') || ('9' < *local_28)) break;
    p = (char *)((long)p * 10 + (ulong)((int)*local_28 - 0x30));
    local_28 = local_28 + 1;
  }
  this = (RapidJSONException *)__cxa_allocate_exception(0x10);
  cereal::RapidJSONException::RapidJSONException
            (this,"rapidjson internal assertion failure: *p >= \'0\' && *p <= \'9\'");
  __cxa_throw(this,&cereal::RapidJSONException::typeinfo,
              cereal::RapidJSONException::~RapidJSONException);
}

Assistant:

static uint64_t ParseUint64(const char* begin, const char* end) {
        uint64_t r = 0;
        for (const char* p = begin; p != end; ++p) {
            CEREAL_RAPIDJSON_ASSERT(*p >= '0' && *p <= '9');
            r = r * 10u + static_cast<unsigned>(*p - '0');
        }
        return r;
    }